

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

_Bool prof_dump_printf(_Bool propagate_err,char *format,...)

{
  prof_tdata_t *ppVar1;
  prof_tdata_t *ppVar2;
  char in_AL;
  prof_tdata_t *ppVar3;
  uint uVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  prof_tdata_t *node;
  _func_prof_tdata_t_ptr_prof_tdata_tree_t_ptr_prof_tdata_t_ptr_void_ptr *cb_00;
  prof_tdata_t *tdata;
  prof_tdata_tree_t *rbtree;
  void *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [128];
  __va_list_tag local_158;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 local_120;
  void *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  prof_tdata_tree_t local_88 [17];
  _func_prof_tdata_t_ptr_prof_tdata_tree_t_ptr_prof_tdata_t_ptr_void_ptr *cb;
  
  local_158.reg_save_area = local_138;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_158.gp_offset = 0x10;
  local_158.fp_offset = 0x30;
  local_158.overflow_arg_area = &ap[0].overflow_arg_area;
  rbtree = local_88;
  tdata = (prof_tdata_t *)0x80;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  malloc_vsnprintf((char *)rbtree,0x80,format,&local_158);
  ppVar3 = rbtree[1].rbt_root;
  while( true ) {
    ppVar1 = (prof_tdata_t *)tdata->thr_uid;
    uVar4 = (uint)(ppVar3 >= ppVar1 && ppVar3 != ppVar1) - (uint)(ppVar3 < ppVar1);
    if (uVar4 == 0) {
      ppVar1 = rbtree[2].rbt_root;
      ppVar2 = (prof_tdata_t *)tdata->thr_discrim;
      uVar4 = (uint)(ppVar1 >= ppVar2 && ppVar1 != ppVar2) - (uint)(ppVar1 < ppVar2);
    }
    cb = (_func_prof_tdata_t_ptr_prof_tdata_tree_t_ptr_prof_tdata_t_ptr_void_ptr *)(ulong)uVar4;
    if ((int)uVar4 < 0) break;
    if (uVar4 == 0) goto LAB_0013eb09;
    tdata = (prof_tdata_t *)((ulong)(tdata->tdata_link).rbn_right_red & 0xfffffffffffffffe);
  }
  ppVar3 = tdata_tree_iter_start(rbtree,(tdata->tdata_link).rbn_left,node,cb,in_R8);
  if (ppVar3 != (prof_tdata_t *)0x0) goto LAB_0013eb19;
LAB_0013eb09:
  ppVar3 = prof_tdata_reset_iter(rbtree,tdata,node);
  if (ppVar3 == (prof_tdata_t *)0x0) {
    ppVar3 = tdata_tree_iter_recurse
                       ((prof_tdata_tree_t *)
                        ((ulong)(tdata->tdata_link).rbn_right_red & 0xfffffffffffffffe),node,cb_00,
                        cb);
    return SUB81(ppVar3,0);
  }
LAB_0013eb19:
  return SUB81(ppVar3,0);
}

Assistant:

static bool
prof_dump_printf(bool propagate_err, const char *format, ...) {
	bool ret;
	va_list ap;
	char buf[PROF_PRINTF_BUFSIZE];

	va_start(ap, format);
	malloc_vsnprintf(buf, sizeof(buf), format, ap);
	va_end(ap);
	ret = prof_dump_write(propagate_err, buf);

	return ret;
}